

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void SettingsHandlerWindow_WriteAll
               (ImGuiContext *imgui_ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  float fVar1;
  int iVar2;
  ImGuiWindow **ppIVar3;
  ImGuiWindowSettings *pIVar4;
  char *pcVar5;
  ImGuiTextBuffer *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  char *p;
  char *name;
  ImGuiWindowSettings *settings_1;
  int i_1;
  ImGuiWindowSettings *settings;
  ImGuiWindow *window;
  int i;
  ImGuiContext *g;
  ImGuiTextBuffer *pIVar6;
  ImGuiWindowSettings *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  char *local_50;
  int local_3c;
  ImGuiWindowSettings *local_38;
  ImGuiWindow *name_00;
  int local_24;
  
  for (local_24 = 0; local_24 != *(int *)(in_RDI + 0x19a0); local_24 = local_24 + 1) {
    ppIVar3 = ImVector<ImGuiWindow_*>::operator[]
                        ((ImVector<ImGuiWindow_*> *)(in_RDI + 0x19a0),local_24);
    name_00 = *ppIVar3;
    if ((name_00->Flags & 0x100U) == 0) {
      if (name_00->SettingsIdx == -1) {
        in_stack_ffffffffffffffa0 =
             ImGui::FindWindowSettings((ImGuiID)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
      }
      else {
        in_stack_ffffffffffffffa0 =
             ImVector<ImGuiWindowSettings>::operator[]
                       ((ImVector<ImGuiWindowSettings> *)(in_RDI + 0x2dc0),name_00->SettingsIdx);
      }
      local_38 = in_stack_ffffffffffffffa0;
      if (in_stack_ffffffffffffffa0 == (ImGuiWindowSettings *)0x0) {
        local_38 = ImGui::CreateNewWindowSettings((char *)name_00);
        iVar2 = ImVector<ImGuiWindowSettings>::index_from_ptr
                          ((ImVector<ImGuiWindowSettings> *)(in_RDI + 0x2dc0),local_38);
        name_00->SettingsIdx = iVar2;
      }
      local_38->Pos = name_00->Pos;
      local_38->Size = name_00->SizeFull;
      local_38->Collapsed = (bool)(name_00->Collapsed & 1);
    }
  }
  pIVar6 = in_RDX;
  ImGuiTextBuffer::size(in_RDX);
  ImGuiTextBuffer::reserve
            ((ImGuiTextBuffer *)in_stack_ffffffffffffffa0,(int)((ulong)pIVar6 >> 0x20));
  for (local_3c = 0; local_3c != *(int *)(in_RDI + 0x2dc0); local_3c = local_3c + 1) {
    pIVar4 = ImVector<ImGuiWindowSettings>::operator[]
                       ((ImVector<ImGuiWindowSettings> *)(in_RDI + 0x2dc0),local_3c);
    fVar1 = (pIVar4->Pos).x;
    if ((fVar1 != 3.4028235e+38) || (NAN(fVar1))) {
      local_50 = pIVar4->Name;
      pcVar5 = strstr(local_50,"###");
      if (pcVar5 != (char *)0x0) {
        local_50 = pcVar5;
      }
      ImGuiTextBuffer::appendf(in_RDX,"[%s][%s]\n",*in_RSI,local_50);
      ImGuiTextBuffer::appendf
                (in_RDX,"Pos=%d,%d\n",(ulong)(uint)(int)(pIVar4->Pos).x,
                 (ulong)(uint)(int)(pIVar4->Pos).y);
      ImGuiTextBuffer::appendf
                (in_RDX,"Size=%d,%d\n",(ulong)(uint)(int)(pIVar4->Size).x,
                 (ulong)(uint)(int)(pIVar4->Size).y);
      ImGuiTextBuffer::appendf(in_RDX,"Collapsed=%d\n",(ulong)(pIVar4->Collapsed & 1));
      ImGuiTextBuffer::appendf(in_RDX,"\n");
    }
  }
  return;
}

Assistant:

static void SettingsHandlerWindow_WriteAll(ImGuiContext* imgui_ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    // Gather data from windows that were active during this session
    // (if a window wasn't opened in this session we preserve its settings)
    ImGuiContext& g = *imgui_ctx;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_NoSavedSettings)
            continue;

        ImGuiWindowSettings* settings = (window->SettingsIdx != -1) ? &g.SettingsWindows[window->SettingsIdx] : ImGui::FindWindowSettings(window->ID);
        if (!settings)
        {
            settings = ImGui::CreateNewWindowSettings(window->Name);
            window->SettingsIdx = g.SettingsWindows.index_from_ptr(settings);
        }
        IM_ASSERT(settings->ID == window->ID);
        settings->Pos = window->Pos;
        settings->Size = window->SizeFull;
        settings->Collapsed = window->Collapsed;
    }

    // Write to text buffer
    buf->reserve(buf->size() + g.SettingsWindows.Size * 96); // ballpark reserve
    for (int i = 0; i != g.SettingsWindows.Size; i++)
    {
        const ImGuiWindowSettings* settings = &g.SettingsWindows[i];
        if (settings->Pos.x == FLT_MAX)
            continue;
        const char* name = settings->Name;
        if (const char* p = strstr(name, "###"))  // Skip to the "###" marker if any. We don't skip past to match the behavior of GetID()
            name = p;
        buf->appendf("[%s][%s]\n", handler->TypeName, name);
        buf->appendf("Pos=%d,%d\n", (int)settings->Pos.x, (int)settings->Pos.y);
        buf->appendf("Size=%d,%d\n", (int)settings->Size.x, (int)settings->Size.y);
        buf->appendf("Collapsed=%d\n", settings->Collapsed);
        buf->appendf("\n");
    }
}